

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O2

void decode_fglrx_ioctl_50(fglrx_ioctl_50 *d,mmt_memory_dump *args,int argc)

{
  uint uVar1;
  int iVar2;
  mmt_buf *buf;
  
  uVar1 = d->kernel_ver_len;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("kernel_ver_len");
    if (iVar2 != 0) goto LAB_0024a70c;
  }
  else {
LAB_0024a70c:
    fprintf(_stdout,"%skernel_ver_len: %d",fglrx_pfx,(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  if (d->_pad04 != 0) {
    fprintf(_stdout,"%s%s_pad04: 0x%08x%s",", ",colors->err,(ulong)d->_pad04,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->kernel_ver == 0) {
    iVar2 = _fglrx_field_enabled("kernel_ver");
    if (iVar2 == 0) goto LAB_0024a80c;
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%skernel_ver: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%skernel_ver: 0x%016lx",", ");
    if (0 < argc) {
      buf = find_ptr(d->kernel_ver,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0024a80f;
    }
    fputs(" [no data]",_stdout);
LAB_0024a80c:
    buf = (mmt_buf *)0x0;
  }
LAB_0024a80f:
  fglrx_pfx = ", ";
  uVar1 = d->unk10;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk10");
    if (iVar2 != 0) goto LAB_0024a82d;
  }
  else {
LAB_0024a82d:
    fprintf(_stdout,"%sunk10: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk14;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk14");
    if (iVar2 != 0) goto LAB_0024a86c;
  }
  else {
LAB_0024a86c:
    fprintf(_stdout,"%sunk14: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk18;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk18");
    if (iVar2 != 0) goto LAB_0024a8ab;
  }
  else {
LAB_0024a8ab:
    fprintf(_stdout,"%sunk18: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk1c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk1c");
    if (iVar2 != 0) goto LAB_0024a8ea;
  }
  else {
LAB_0024a8ea:
    fprintf(_stdout,"%sunk1c: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk20;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk20");
    if (iVar2 != 0) goto LAB_0024a929;
  }
  else {
LAB_0024a929:
    fprintf(_stdout,"%sunk20: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk24;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk24");
    if (iVar2 != 0) goto LAB_0024a968;
  }
  else {
LAB_0024a968:
    fprintf(_stdout,"%sunk24: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk28;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk28");
    if (iVar2 != 0) goto LAB_0024a9a7;
  }
  else {
LAB_0024a9a7:
    fprintf(_stdout,"%sunk28: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk2c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk2c");
    if (iVar2 != 0) goto LAB_0024a9e6;
  }
  else {
LAB_0024a9e6:
    fprintf(_stdout,"%sunk2c: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk30;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk30");
    if (iVar2 != 0) goto LAB_0024aa25;
  }
  else {
LAB_0024aa25:
    fprintf(_stdout,"%sunk30: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk34;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk34");
    if (iVar2 != 0) goto LAB_0024aa64;
  }
  else {
LAB_0024aa64:
    fprintf(_stdout,"%sunk34: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk38;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk38");
    if (iVar2 != 0) goto LAB_0024aaa3;
  }
  else {
LAB_0024aaa3:
    fprintf(_stdout,"%sunk38: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk3c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk3c");
    if (iVar2 != 0) goto LAB_0024aae2;
  }
  else {
LAB_0024aae2:
    fprintf(_stdout,"%sunk3c: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk40;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk40");
    if (iVar2 != 0) goto LAB_0024ab21;
  }
  else {
LAB_0024ab21:
    fprintf(_stdout,"%sunk40: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk44;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk44");
    if (iVar2 != 0) goto LAB_0024ab60;
  }
  else {
LAB_0024ab60:
    fprintf(_stdout,"%sunk44: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk48;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk48");
    if (iVar2 != 0) goto LAB_0024ab9f;
  }
  else {
LAB_0024ab9f:
    fprintf(_stdout,"%sunk48: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk4c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk4c");
    if (iVar2 != 0) goto LAB_0024abde;
  }
  else {
LAB_0024abde:
    fprintf(_stdout,"%sunk4c: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk50;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk50");
    if (iVar2 != 0) goto LAB_0024ac1d;
  }
  else {
LAB_0024ac1d:
    fprintf(_stdout,"%sunk50: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk54;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk54");
    if (iVar2 == 0) goto LAB_0024ac7d;
  }
  fprintf(_stdout,"%sunk54: 0x%08x",", ",(ulong)uVar1);
LAB_0024ac7d:
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(buf,"kernel_ver");
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_50(struct fglrx_ioctl_50 *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_d32(d, kernel_ver_len);
	fglrx_print_pad_x32(d, _pad04);
	struct mmt_buf *data1 = fglrx_print_ptr(d, kernel_ver, args, argc);
	fglrx_print_x32(d, unk10);
	fglrx_print_x32(d, unk14);
	fglrx_print_x32(d, unk18);
	fglrx_print_x32(d, unk1c);
	fglrx_print_x32(d, unk20);
	fglrx_print_x32(d, unk24);
	fglrx_print_x32(d, unk28);
	fglrx_print_x32(d, unk2c);
	fglrx_print_x32(d, unk30);
	fglrx_print_x32(d, unk34);
	fglrx_print_x32(d, unk38);
	fglrx_print_x32(d, unk3c);
	fglrx_print_x32(d, unk40);
	fglrx_print_x32(d, unk44);
	fglrx_print_x32(d, unk48);
	fglrx_print_x32(d, unk4c);
	fglrx_print_x32(d, unk50);
	fglrx_print_x32(d, unk54);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_text(data1, "kernel_ver");
}